

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O3

void Of_ManComputeCuts(Of_Man_t *p)

{
  undefined8 uVar1;
  Gia_Man_t *pGVar2;
  uint uVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  uint *puVar7;
  int *piVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  
  pGVar2 = p->pGia;
  uVar6 = (ulong)(uint)pGVar2->nObjs;
  if (0 < pGVar2->nObjs) {
    pGVar5 = pGVar2->pObjs;
    if (pGVar5 != (Gia_Obj_t *)0x0) {
      lVar13 = 0;
      uVar12 = 0;
      do {
        uVar3 = (uint)*(undefined8 *)(&pGVar5->field_0x0 + lVar13);
        if ((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) {
          uVar3 = uVar3 & 0x1fffffff;
          if ((uVar3 == 0x1fffffff) ||
             (uVar3 != ((uint)((ulong)*(undefined8 *)(&pGVar5->field_0x0 + lVar13) >> 0x20) &
                       0x1fffffff))) {
            Of_ObjMergeOrder(p,(int)uVar12);
            pGVar2 = p->pGia;
          }
          else {
            iVar4 = (int)(-uVar3 + uVar12);
            if ((iVar4 < 0) || (uVar9 = (p->vCutFlows).nSize, (int)uVar9 <= iVar4))
            goto LAB_007981e2;
            if (uVar9 <= uVar12) {
LAB_00798220:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            uVar6 = -uVar3 + uVar12 & 0xffffffff;
            piVar8 = (p->vCutFlows).pArray;
            piVar8[uVar12] = piVar8[uVar6];
            uVar3 = (p->vCutDelays).nSize;
            if ((int)uVar3 <= iVar4) goto LAB_007981e2;
            if (uVar3 <= uVar12) goto LAB_00798220;
            piVar8 = (p->vCutDelays).pArray;
            piVar8[uVar12] = piVar8[uVar6];
          }
        }
        uVar12 = uVar12 + 1;
        uVar6 = (ulong)pGVar2->nObjs;
        if ((long)uVar6 <= (long)uVar12) break;
        pGVar5 = pGVar2->pObjs;
        lVar13 = lVar13 + 0xc;
      } while (pGVar5 != (Gia_Obj_t *)0x0);
    }
    if ((0 < (int)uVar6) && (pGVar5 = pGVar2->pObjs, pGVar5 != (Gia_Obj_t *)0x0)) {
      lVar13 = 0;
      do {
        uVar1 = *(undefined8 *)(pGVar5 + lVar13);
        uVar3 = (uint)uVar1;
        if (((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) &&
           (((uVar3 & 0x1fffffff) == 0x1fffffff ||
            ((uVar3 & 0x1fffffff) != ((uint)((ulong)uVar1 >> 0x20) & 0x1fffffff))))) {
          if ((p->vCutSets).nSize <= lVar13) {
LAB_007981e2:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar3 = (p->vCutSets).pArray[lVar13];
          uVar9 = (int)uVar3 >> 0x10;
          if (((int)uVar9 < 0) || ((p->vPages).nSize <= (int)uVar9)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          if (uVar3 == 0) {
            __assert_fail("Of_ObjHasCuts(p, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                          ,0x19e,"void Of_ManLiftCuts(Of_Man_t *, int)");
          }
          piVar8 = (int *)((ulong)((uVar3 & 0xffff) << 2) + (long)(p->vPages).pArray[uVar9]);
          iVar4 = *piVar8;
          if (0 < iVar4) {
            puVar7 = (uint *)(piVar8 + 1);
            iVar10 = 0;
            do {
              uVar3 = *puVar7;
              if ((uVar3 & 0x1f) == 0) {
                lVar11 = 4;
              }
              else {
                uVar6 = 0;
                do {
                  if ((int)puVar7[uVar6 + 1] < 0) {
                    __assert_fail("Var >= 0 && !(c >> 1)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                  ,0x12e,"int Abc_Var2Lit(int, int)");
                  }
                  puVar7[uVar6 + 1] = puVar7[uVar6 + 1] * 2;
                  uVar6 = uVar6 + 1;
                } while ((uVar3 & 0x1f) != uVar6);
                iVar4 = *piVar8;
                lVar11 = ((ulong)uVar3 & 0x1f) + 4;
              }
              iVar10 = iVar10 + 1;
              puVar7 = puVar7 + lVar11;
            } while (iVar10 < iVar4);
            uVar6 = (ulong)(uint)pGVar2->nObjs;
          }
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < (int)uVar6);
    }
  }
  return;
}

Assistant:

void Of_ManComputeCuts( Of_Man_t * p )
{
    Gia_Obj_t * pObj; int i, iFanin;
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
        {
            iFanin = Gia_ObjFaninId0(pObj, i);
            Of_ObjSetCutFlow( p, i,  Of_ObjCutFlow(p, iFanin) );
            Of_ObjSetCutDelay( p, i, Of_ObjCutDelay(p, iFanin) );
        }
        else
            Of_ObjMergeOrder( p, i );
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( !Gia_ObjIsBuf(pObj) )
            Of_ManLiftCuts( p, i );
}